

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  ui32_t sid;
  OP1aHeader *pOVar1;
  AESEncContext *pAVar2;
  bool bVar3;
  int iVar4;
  ILogSink *this_00;
  byte_t *pbVar5;
  uint *puVar6;
  FileWriter local_230 [111];
  undefined1 local_1c1;
  undefined1 local_1c0 [8];
  UL TmpUL;
  Partition GSPart;
  UL local_c0;
  Batch<ASDCP::UL> local_a0 [80];
  ui64_t local_50;
  fpos_t here;
  HMACContext *HMAC_local;
  AESEncContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  h__Writer *this_local;
  Result_t *result;
  
  HMAC_local = HMAC;
  Ctx_local = Ctx;
  FrameBuf_local = FrameBuf;
  this_local = this;
  bVar3 = ASDCP::MXF::h__WriterState::Test_RUNNING((h__WriterState *)(FrameBuf + 10));
  if (bVar3) {
    local_50 = Kumu::IFileReader::TellPosition((IFileReader *)&FrameBuf->field_0x10);
    if (*(long *)&FrameBuf->field_0x8 == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x25e,
                    "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource(const ASDCP::TimedText::FrameBuffer &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                   );
    }
    if ((WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
         ::GenericStream_DataElement == '\0') &&
       (iVar4 = __cxa_guard_acquire(&WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
                                     ::GenericStream_DataElement), iVar4 != 0)) {
      pbVar5 = ASDCP::Dictionary::ul
                         (*(Dictionary **)&FrameBuf->field_0x8,MDD_GenericStream_DataElement);
      ASDCP::UL::UL(&WriteAncillaryResource::GenericStream_DataElement,pbVar5);
      __cxa_atexit(ASDCP::UL::~UL,&WriteAncillaryResource::GenericStream_DataElement,&__dso_handle);
      __cxa_guard_release(&WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
                           ::GenericStream_DataElement);
    }
    ASDCP::MXF::Partition::Partition
              ((Partition *)&stack0xfffffffffffffe78,*(Dictionary **)&FrameBuf->field_0x8);
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)FrameBuf[8].m_AssetID);
    ASDCP::UL::operator=(&local_c0,(UL *)&FrameBuf[3].field_0x10);
    sid = *(ui32_t *)&FrameBuf[0x12].m_MIMEType;
    *(ui32_t *)&FrameBuf[0x12].m_MIMEType = sid + 1;
    ASDCP::MXF::RIP::PartitionPair::PartitionPair
              ((PartitionPair *)(TmpUL.super_Identifier<16U>.m_Value + 0xf),sid,local_50);
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)FrameBuf[8].m_AssetID,(value_type *)(TmpUL.super_Identifier<16U>.m_Value + 0xf));
    ASDCP::MXF::RIP::PartitionPair::~PartitionPair
              ((PartitionPair *)(TmpUL.super_Identifier<16U>.m_Value + 0xf));
    ASDCP::MXF::Batch<ASDCP::UL>::operator=
              (local_a0,(Batch<ASDCP::UL> *)(FrameBuf[3].m_AssetID + 8));
    pbVar5 = ASDCP::Dictionary::ul(*(Dictionary **)&FrameBuf->field_0x8,MDD_GenericStreamPartition);
    ASDCP::UL::UL((UL *)local_1c0,pbVar5);
    local_1c1 = 0;
    ASDCP::MXF::Partition::WriteToFile((FileWriter *)this,(UL *)&stack0xfffffffffffffe78);
    iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    pAVar2 = Ctx_local;
    if (-1 < iVar4) {
      pOVar1 = *(OP1aHeader **)&FrameBuf->field_0x8;
      puVar6 = (uint *)Kumu::Identifier<16U>::Value
                                 (&WriteAncillaryResource::GenericStream_DataElement.
                                   super_Identifier<16U>);
      ASDCP::Write_EKLV_Packet
                (local_230,(Dictionary *)&FrameBuf->field_0x10,pOVar1,
                 (WriterInfo *)((long)&(FrameBuf->m_MIMEType).field_2 + 8),
                 (FrameBuffer *)&FrameBuf[10].field_0x8,(uint *)(FrameBuf[9].m_AssetID + 8),
                 (ulonglong *)&FrameBuf[9].field_0x20,(FrameBuffer *)FrameBuf[9].m_AssetID,
                 (uchar *)pAVar2,puVar6,(AESEncContext *)&ASDCP::MXF_BER_LENGTH,HMAC_local);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_230);
      Kumu::Result_t::~Result_t((Result_t *)local_230);
    }
    *(int *)&FrameBuf[9].field_0x20 = *(int *)&FrameBuf[9].field_0x20 + 1;
    local_1c1 = 1;
    ASDCP::UL::~UL((UL *)local_1c0);
    ASDCP::MXF::Partition::~Partition((Partition *)&stack0xfffffffffffffe78);
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
               ,0x259);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource(const ASDCP::TimedText::FrameBuffer& FrameBuf,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  if ( ! m_State.Test_RUNNING() )
    {
      KM_RESULT_STATE_HERE();
      return RESULT_STATE;
    }

  Kumu::fpos_t here = m_File.TellPosition();
  assert(m_Dict);

  // create generic stream partition header
  static UL GenericStream_DataElement(m_Dict->ul(MDD_GenericStream_DataElement));
  ASDCP::MXF::Partition GSPart(m_Dict);

  GSPart.MajorVersion = m_HeaderPart.MajorVersion;
  GSPart.MinorVersion = m_HeaderPart.MinorVersion;
  GSPart.ThisPartition = here;
  GSPart.PreviousPartition = m_RIP.PairArray.back().ByteOffset;
  GSPart.BodySID = m_EssenceStreamID;
  GSPart.OperationalPattern = m_HeaderPart.OperationalPattern;

  m_RIP.PairArray.push_back(RIP::PartitionPair(m_EssenceStreamID++, here));
  GSPart.EssenceContainers = m_HeaderPart.EssenceContainers;
  UL TmpUL(m_Dict->ul(MDD_GenericStreamPartition));
  Result_t result = GSPart.WriteToFile(m_File, TmpUL);

  if ( KM_SUCCESS(result) )
    {
      result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				 m_StreamOffset, FrameBuf, GenericStream_DataElement.Value(),
				 MXF_BER_LENGTH, Ctx, HMAC);
    }

  m_FramesWritten++;
  return result;
}